

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Opt *pOVar1;
  StringRef optName;
  StringRef optName_00;
  StringRef optName_01;
  StringRef optName_02;
  StringRef optName_03;
  StringRef optName_04;
  StringRef optName_05;
  StringRef optName_06;
  StringRef optName_07;
  StringRef optName_08;
  StringRef optName_09;
  StringRef optName_10;
  StringRef optName_11;
  StringRef optName_12;
  StringRef optName_13;
  StringRef optName_14;
  StringRef optName_15;
  StringRef optName_16;
  StringRef optName_17;
  StringRef optName_18;
  StringRef optName_19;
  StringRef optName_20;
  StringRef optName_21;
  StringRef optName_22;
  StringRef optName_23;
  StringRef optName_24;
  StringRef optName_25;
  StringRef optName_26;
  StringRef optName_27;
  StringRef optName_28;
  StringRef optName_29;
  StringRef optName_30;
  StringRef optName_31;
  StringRef optName_32;
  StringRef optName_33;
  StringRef optName_34;
  StringRef optName_35;
  StringRef optName_36;
  StringRef optName_37;
  StringRef optName_38;
  StringRef optName_39;
  StringRef optName_40;
  StringRef optName_41;
  StringRef optName_42;
  StringRef optName_43;
  StringRef optName_44;
  StringRef optName_45;
  StringRef optName_46;
  StringRef optName_47;
  StringRef optName_48;
  ExeName local_19c0;
  Opt local_1998;
  Arg local_1940;
  Opt local_1900;
  Opt local_18a8;
  Opt local_1850;
  Opt local_17f8;
  Opt local_17a0;
  Opt local_1748;
  Opt local_16f0;
  Opt local_1698;
  Opt local_1640;
  Opt local_15e8;
  Opt local_1590;
  Opt local_1538;
  Opt local_14e0;
  Opt local_1488;
  Opt local_1430;
  Opt local_13d8;
  Opt local_1380;
  Opt local_1328;
  Opt local_12d0;
  Opt local_1278;
  Opt local_1220;
  Opt local_11c8;
  Opt local_1170;
  Opt local_1118;
  Opt local_10c0;
  Opt local_1068;
  Opt local_1010;
  Opt local_fb8;
  Opt local_f60;
  Opt local_f08;
  Opt local_eb0;
  Opt local_e58;
  Opt local_e00;
  Help local_da8;
  Parser local_d50;
  Parser local_cf0;
  Parser local_c90;
  Parser local_c30;
  Parser local_bd0;
  Parser local_b70;
  Parser local_b10;
  Parser local_ab0;
  Parser local_a50;
  Parser local_9f0;
  Parser local_990;
  Parser local_930;
  Parser local_8d0;
  Parser local_870;
  Parser local_810;
  Parser local_7b0;
  Parser local_750;
  Parser local_6f0;
  Parser local_690;
  Parser local_630;
  Parser local_5d0;
  Parser local_570;
  Parser local_510;
  Parser local_4b0;
  Parser local_450;
  Parser local_3f0;
  Parser local_390;
  Parser local_330;
  Parser local_2d0;
  Parser local_270;
  Parser local_210;
  Parser local_1b0;
  Parser local_150;
  Parser local_f0;
  Parser local_90;
  
  Clara::ExeName::ExeName(&local_19c0,&config->processName);
  Clara::Help::Help(&local_da8,&config->showHelp);
  Clara::Detail::ComposableParserImpl<Catch::Clara::ExeName>::operator|
            (&local_d50,&local_19c0.super_ComposableParserImpl<Catch::Clara::ExeName>,&local_da8);
  Clara::Opt::Opt(&local_e00,&config->showSuccessfulTests);
  optName.m_size = 2;
  optName.m_start = "-s";
  pOVar1 = Clara::Opt::operator[](&local_e00,optName);
  optName_00.m_size = 9;
  optName_00.m_start = "--success";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_00);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "include successful tests in output";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x22;
  Clara::operator|(&local_cf0,&local_d50,pOVar1);
  Clara::Opt::Opt(&local_e58,&config->shouldDebugBreak);
  optName_01.m_size = 2;
  optName_01.m_start = "-b";
  pOVar1 = Clara::Opt::operator[](&local_e58,optName_01);
  optName_02.m_size = 7;
  optName_02.m_start = "--break";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_02);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "break into debugger on failure";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1e;
  Clara::operator|(&local_c90,&local_cf0,pOVar1);
  Clara::Opt::Opt(&local_eb0,&config->noThrow);
  optName_03.m_size = 2;
  optName_03.m_start = "-e";
  pOVar1 = Clara::Opt::operator[](&local_eb0,optName_03);
  optName_04.m_size = 9;
  optName_04.m_start = "--nothrow";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_04);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "skip exception tests";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x14;
  Clara::operator|(&local_c30,&local_c90,pOVar1);
  Clara::Opt::Opt(&local_f08,&config->showInvisibles);
  optName_05.m_size = 2;
  optName_05.m_start = "-i";
  pOVar1 = Clara::Opt::operator[](&local_f08,optName_05);
  optName_06.m_size = 0xc;
  optName_06.m_start = "--invisibles";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_06);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "show invisibles (tabs, newlines)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x20;
  Clara::operator|(&local_bd0,&local_c30,pOVar1);
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b2770;
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b27c0;
  *(string **)
   &local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = &config->defaultOutputFilename;
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "filename";
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 8;
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1278.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1278.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1278.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_07.m_size = 2;
  optName_07.m_start = "-o";
  pOVar1 = Clara::Opt::operator[](&local_1278,optName_07);
  optName_08.m_size = 5;
  optName_08.m_start = "--out";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_08);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "default output filename"
  ;
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x17;
  Clara::operator|(&local_b70,&local_bd0,pOVar1);
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b16e0;
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  *(ConfigData **)
   &local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1730;
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "name[::key=value]*";
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x12;
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_12d0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_09.m_size = 2;
  optName_09.m_start = "-r";
  pOVar1 = Clara::Opt::operator[](&local_12d0,optName_09);
  optName_10.m_size = 10;
  optName_10.m_start = "--reporter";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_10);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "reporter to use (defaults to console)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x25;
  Clara::operator|(&local_b10,&local_b70,pOVar1);
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b2770;
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b27c0;
  *(string **)
   &local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = &config->name;
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "name";
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 4;
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1328.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1328.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1328.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_11.m_size = 2;
  optName_11.m_start = "-n";
  pOVar1 = Clara::Opt::operator[](&local_1328,optName_11);
  optName_12.m_size = 6;
  optName_12.m_start = "--name";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_12);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "suite name";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 10;
  Clara::operator|(&local_ab0,&local_b10,pOVar1);
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b17d0;
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1820;
  *(ConfigData **)
   &local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
     super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_use_count =
         (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
          super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
     super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_use_count = 2;
  }
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "";
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0;
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
             super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1998.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1998.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1998.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_13.m_size = 2;
  optName_13.m_start = "-a";
  pOVar1 = Clara::Opt::operator[](&local_1998,optName_13);
  optName_14.m_size = 7;
  optName_14.m_start = "--abort";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_14);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "abort at first failure";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_a50,&local_ab0,pOVar1);
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1870;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b18c0;
  *(ConfigData **)
   &local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "no. failures";
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xc;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1380.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1380.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1380.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_15.m_size = 2;
  optName_15.m_start = "-x";
  pOVar1 = Clara::Opt::operator[](&local_1380,optName_15);
  optName_16.m_size = 8;
  optName_16.m_start = "--abortx";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_16);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "abort after x failures";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_9f0,&local_a50,pOVar1);
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1910;
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  *(ConfigData **)
   &local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1960;
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "warning name";
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xc;
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_13d8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13d8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13d8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_17.m_size = 2;
  optName_17.m_start = "-w";
  pOVar1 = Clara::Opt::operator[](&local_13d8,optName_17);
  optName_18.m_size = 6;
  optName_18.m_start = "--warn";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_18);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "enable warnings";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0xf;
  Clara::operator|(&local_990,&local_9f0,pOVar1);
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1a00;
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1a50;
  *(ConfigData **)
   &local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "yes|no";
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 6;
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1430.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1430.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1430.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_19.m_size = 2;
  optName_19.m_start = "-d";
  pOVar1 = Clara::Opt::operator[](&local_1430,optName_19);
  optName_20.m_size = 0xb;
  optName_20.m_start = "--durations";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_20);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "show test durations";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x13;
  Clara::operator|(&local_930,&local_990,pOVar1);
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b2810;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b2860;
  *(double **)
   &local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = &config->minDuration;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "seconds";
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 7;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1488.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1488.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1488.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_21.m_size = 2;
  optName_21.m_start = "-D";
  pOVar1 = Clara::Opt::operator[](&local_1488,optName_21);
  optName_22.m_size = 0xe;
  optName_22.m_start = "--min-duration";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_22);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "show test durations for tests taking at least the given number of seconds";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x49;
  Clara::operator|(&local_8d0,&local_930,pOVar1);
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1aa0;
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1af0;
  *(ConfigData **)
   &local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "filename";
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 8;
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_14e0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14e0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14e0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_23.m_size = 2;
  optName_23.m_start = "-f";
  pOVar1 = Clara::Opt::operator[](&local_14e0,optName_23);
  optName_24.m_size = 0xc;
  optName_24.m_start = "--input-file";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_24);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "load test names to run from a file";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x22;
  Clara::operator|(&local_870,&local_8d0,pOVar1);
  Clara::Opt::Opt(&local_f60,&config->filenamesAsTags);
  optName_25.m_size = 2;
  optName_25.m_start = "-#";
  pOVar1 = Clara::Opt::operator[](&local_f60,optName_25);
  optName_26.m_size = 0x13;
  optName_26.m_start = "--filenames-as-tags";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_26);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "adds a tag for the filename";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1b;
  Clara::operator|(&local_810,&local_870,pOVar1);
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b2618;
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b2668;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)&local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = &config->sectionsToRun;
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "section name";
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xc;
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1538.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1538.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1538.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_27.m_size = 2;
  optName_27.m_start = "-c";
  pOVar1 = Clara::Opt::operator[](&local_1538,optName_27);
  optName_28.m_size = 9;
  optName_28.m_start = "--section";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_28);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "specify section to run";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_7b0,&local_810,pOVar1);
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1b40;
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1b90;
  *(ConfigData **)
   &local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "quiet|normal|high";
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x11;
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1590.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1590.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1590.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_29.m_size = 2;
  optName_29.m_start = "-v";
  pOVar1 = Clara::Opt::operator[](&local_1590,optName_29);
  optName_30.m_size = 0xb;
  optName_30.m_start = "--verbosity";
  pOVar1 = Clara::Opt::operator[](pOVar1,optName_30);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "set output verbosity";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x14;
  Clara::operator|(&local_750,&local_7b0,pOVar1);
  Clara::Opt::Opt(&local_fb8,&config->listTests);
  optName_31.m_size = 0xc;
  optName_31.m_start = "--list-tests";
  pOVar1 = Clara::Opt::operator[](&local_fb8,optName_31);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "list all/matching test cases";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1c;
  Clara::operator|(&local_6f0,&local_750,pOVar1);
  Clara::Opt::Opt(&local_1010,&config->listTags);
  optName_32.m_size = 0xb;
  optName_32.m_start = "--list-tags";
  pOVar1 = Clara::Opt::operator[](&local_1010,optName_32);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "list all/matching tags";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x16;
  Clara::operator|(&local_690,&local_6f0,pOVar1);
  Clara::Opt::Opt(&local_1068,&config->listReporters);
  optName_33.m_size = 0x10;
  optName_33.m_start = "--list-reporters";
  pOVar1 = Clara::Opt::operator[](&local_1068,optName_33);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "list all available reporters";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1c;
  Clara::operator|(&local_630,&local_690,pOVar1);
  Clara::Opt::Opt(&local_10c0,&config->listListeners);
  optName_34.m_size = 0x10;
  optName_34.m_start = "--list-listeners";
  pOVar1 = Clara::Opt::operator[](&local_10c0,optName_34);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start = "list all listeners";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x12;
  Clara::operator|(&local_5d0,&local_630,pOVar1);
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1be0;
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1c30;
  *(ConfigData **)
   &local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "decl|lex|rand";
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xd;
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_15e8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15e8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_35.m_size = 7;
  optName_35.m_start = "--order";
  pOVar1 = Clara::Opt::operator[](&local_15e8,optName_35);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "test case order (defaults to decl)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x22;
  Clara::operator|(&local_570,&local_5d0,pOVar1);
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1c80;
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1cd0;
  *(ConfigData **)
   &local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start =
       "\'time\'|\'random-device\'|number";
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x1d;
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1640.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1640.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1640.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_36.m_size = 10;
  optName_36.m_start = "--rng-seed";
  pOVar1 = Clara::Opt::operator[](&local_1640,optName_36);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "set a specific seed for random numbers";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x26;
  Clara::operator|(&local_510,&local_570,pOVar1);
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1d20;
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1d70;
  *(ConfigData **)
   &local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "ansi|win32|none|default";
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x17;
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1698.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1698.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1698.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_37.m_size = 0xd;
  optName_37.m_start = "--colour-mode";
  pOVar1 = Clara::Opt::operator[](&local_1698,optName_37);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "what color mode should be used as default";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x29;
  Clara::operator|(&local_4b0,&local_510,pOVar1);
  Clara::Opt::Opt(&local_1118,&config->libIdentify);
  optName_38.m_size = 0xd;
  optName_38.m_start = "--libidentify";
  pOVar1 = Clara::Opt::operator[](&local_1118,optName_38);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "report name and version according to libidentify standard";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x39;
  Clara::operator|(&local_450,&local_4b0,pOVar1);
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1dc0;
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1e10;
  *(ConfigData **)
   &local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "never|start|exit|both";
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x15;
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_16f0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_16f0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16f0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_39.m_size = 0x13;
  optName_39.m_start = "--wait-for-keypress";
  pOVar1 = Clara::Opt::operator[](&local_16f0,optName_39);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "waits for a keypress before exiting";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x23;
  Clara::operator|(&local_3f0,&local_450,pOVar1);
  Clara::Opt::Opt(&local_1170,&config->skipBenchmarks);
  optName_40.m_size = 0x11;
  optName_40.m_start = "--skip-benchmarks";
  pOVar1 = Clara::Opt::operator[](&local_1170,optName_40);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "disable running benchmarks";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x1a;
  Clara::operator|(&local_390,&local_3f0,pOVar1);
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b28b0;
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b2900;
  *(uint **)&local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
             super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi[1]._M_use_count = &config->benchmarkSamples;
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "samples";
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 7;
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1748.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1748.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1748.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_41.m_size = 0x13;
  optName_41.m_start = "--benchmark-samples";
  pOVar1 = Clara::Opt::operator[](&local_1748,optName_41);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "number of samples to collect (default: 100)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x2b;
  Clara::operator|(&local_330,&local_390,pOVar1);
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b28b0;
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b2900;
  *(uint **)&local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
             super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi[1]._M_use_count = &config->benchmarkResamples;
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "resamples";
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 9;
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_17a0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_17a0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17a0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_42.m_size = 0x15;
  optName_42.m_start = "--benchmark-resamples";
  pOVar1 = Clara::Opt::operator[](&local_17a0,optName_42);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "number of resamples for the bootstrap (default: 100000)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x37;
  Clara::operator|(&local_2d0,&local_330,pOVar1);
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b2810;
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b2860;
  *(double **)
   &local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = &config->benchmarkConfidenceInterval;
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "confidence interval";
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x13;
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_17f8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_17f8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17f8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_43.m_size = 0x1f;
  optName_43.m_start = "--benchmark-confidence-interval";
  pOVar1 = Clara::Opt::operator[](&local_17f8,optName_43);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "confidence interval for the bootstrap (between 0 and 1, default: 0.95)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x46;
  Clara::operator|(&local_270,&local_2d0,pOVar1);
  Clara::Opt::Opt(&local_11c8,&config->benchmarkNoAnalysis);
  optName_44.m_size = 0x17;
  optName_44.m_start = "--benchmark-no-analysis";
  pOVar1 = Clara::Opt::operator[](&local_11c8,optName_44);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "perform only measurements; do not perform any analysis";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x36;
  Clara::operator|(&local_210,&local_270,pOVar1);
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b2950;
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b29a0;
  *(rep_conflict **)
   &local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = &config->benchmarkWarmupTime;
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "benchmarkWarmupTime";
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0x13;
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1850.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1850.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1850.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_45.m_size = 0x17;
  optName_45.m_start = "--benchmark-warmup-time";
  pOVar1 = Clara::Opt::operator[](&local_1850,optName_45);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "amount of time in milliseconds spent on warming up each test (default: 100)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x4b;
  Clara::operator|(&local_1b0,&local_210,pOVar1);
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1e60;
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1eb0;
  *(ConfigData **)
   &local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "shard count";
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xb;
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_18a8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18a8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18a8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_46.m_size = 0xd;
  optName_46.m_start = "--shard-count";
  pOVar1 = Clara::Opt::operator[](&local_18a8,optName_46);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "split the tests to execute into this many groups";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x30;
  Clara::operator|(&local_150,&local_1b0,pOVar1);
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1f00;
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1f50;
  *(ConfigData **)
   &local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
    super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = config;
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "shard index";
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0xb;
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  local_1900.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1900.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1900.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optName_47.m_size = 0xd;
  optName_47.m_start = "--shard-index";
  pOVar1 = Clara::Opt::operator[](&local_1900,optName_47);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "index of the group of tests to execute (see --shard-count)";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x3a;
  Clara::operator|(&local_f0,&local_150,pOVar1);
  Clara::Opt::Opt(&local_1220,&config->allowZeroTests);
  optName_48.m_size = 0x18;
  optName_48.m_start = "--allow-running-no-tests";
  pOVar1 = Clara::Opt::operator[](&local_1220,optName_48);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start =
       "Treat \'No tests run\' as a success";
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size = 0x21;
  Clara::operator|(&local_90,&local_f0,pOVar1);
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.super_ComposableParserImpl<Catch::Clara::Arg>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b2508;
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_optionality = Optional;
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
   super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b2618;
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b2668;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)&local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
        super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = &config->testsOrTags;
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_hint.m_start = "test name|pattern|tags";
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_hint.m_size = 0x16;
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.super_ComposableParserImpl<Catch::Clara::Arg>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b0c90;
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_description.m_start =
       "which test or tests to use";
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_description.m_size = 0x1a;
  Clara::operator|(__return_storage_ptr__,&local_90,&local_1940);
  local_1940.super_ParserRefImpl<Catch::Clara::Arg>.super_ComposableParserImpl<Catch::Clara::Arg>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b2508;
  if (local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1940.super_ParserRefImpl<Catch::Clara::Arg>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_90.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_90.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_90.m_options);
  local_90.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_90.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_90.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1220.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1220.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1220.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1220.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1220.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1220.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1220.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1220.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_f0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_f0.m_options);
  local_f0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_f0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1900.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1900.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1900.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1900.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1900.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1900.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_150.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_150.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_150.m_options);
  local_150.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_150.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_150.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_18a8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_18a8.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_18a8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_18a8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18a8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_1b0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_1b0.m_options);
  local_1b0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_1b0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1850.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1850.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1850.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1850.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1850.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1850.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_210.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_210.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_210.m_options);
  local_210.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_210.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_11c8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_11c8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11c8.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_11c8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_11c8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_11c8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_11c8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_11c8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_270.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_270.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_270.m_options);
  local_270.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_270.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_270.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_17f8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_17f8.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_17f8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_17f8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_17f8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_2d0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_2d0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_2d0.m_options);
  local_2d0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_2d0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2d0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_17a0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_17a0.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_17a0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_17a0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_17a0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_330.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_330.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_330.m_options);
  local_330.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_330.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_330.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1748.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1748.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1748.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1748.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1748.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1748.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_390.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_390.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_390.m_options);
  local_390.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_390.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_390.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1170.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1170.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1170.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1170.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1170.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1170.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_3f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_3f0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_3f0.m_options);
  local_3f0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_3f0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_3f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_16f0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_16f0.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_16f0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_16f0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_16f0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_450.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_450.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_450.m_options);
  local_450.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_450.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_450.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_450.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_450.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1118.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1118.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1118.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1118.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1118.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1118.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1118.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1118.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_4b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_4b0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_4b0.m_options);
  local_4b0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_4b0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_4b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1698.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1698.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1698.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1698.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1698.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1698.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_510.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_510.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_510.m_options);
  local_510.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_510.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_510.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_510.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_510.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1640.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1640.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1640.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1640.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1640.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1640.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_570.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_570.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_570.m_options);
  local_570.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_570.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_570.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_570.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_570.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_15e8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15e8.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_15e8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_15e8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15e8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_5d0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_5d0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_5d0.m_options);
  local_5d0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_5d0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5d0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_10c0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_10c0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_10c0.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_10c0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_10c0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_10c0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_10c0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_10c0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_630.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_630.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_630.m_options);
  local_630.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_630.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_630.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_630.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_630.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1068.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1068.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1068.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1068.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1068.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1068.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1068.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_690.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_690.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_690.m_options);
  local_690.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_690.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_690.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_690.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_690.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1010.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1010.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1010.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1010.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1010.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1010.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1010.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1010.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_6f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_6f0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_6f0.m_options);
  local_6f0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_6f0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6f0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_6f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_fb8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_fb8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_fb8.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_fb8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_fb8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_fb8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_fb8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_fb8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_750.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_750.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_750.m_options);
  local_750.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_750.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_750.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_750.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_750.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1590.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1590.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1590.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1590.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1590.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1590.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_7b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_7b0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_7b0.m_options);
  local_7b0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_7b0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_7b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1538.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1538.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1538.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1538.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1538.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1538.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_810.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_810.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_810.m_options);
  local_810.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_810.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_810.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_810.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_810.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_f60.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_f60.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f60.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f60.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f60.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_f60.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_f60.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f60.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_870.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_870.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_870.m_options);
  local_870.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_870.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_870.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_870.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_870.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_14e0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_14e0.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_14e0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_14e0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14e0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_8d0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_8d0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_8d0.m_options);
  local_8d0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_8d0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8d0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8d0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8d0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1488.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1488.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1488.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1488.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1488.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1488.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_930.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_930.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_930.m_options);
  local_930.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_930.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_930.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_930.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_930.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1430.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1430.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1430.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1430.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1430.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1430.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_990.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_990.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_990.m_options);
  local_990.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_990.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_990.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_13d8.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_13d8.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_13d8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_13d8.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_13d8.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_9f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_9f0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_9f0.m_options);
  local_9f0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_9f0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9f0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_9f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1380.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1380.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1380.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1380.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1380.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1380.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_a50.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_a50.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_a50.m_options);
  local_a50.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_a50.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a50.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a50.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a50.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1998.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1998.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1998.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1998.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1998.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1998.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_ab0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_ab0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_ab0.m_options);
  local_ab0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_ab0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ab0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_ab0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ab0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1328.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1328.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1328.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1328.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1328.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1328.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_b10.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_b10.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_b10.m_options);
  local_b10.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_b10.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b10.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b10.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b10.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_12d0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_12d0.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_12d0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_12d0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_12d0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_b70.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_b70.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_b70.m_options);
  local_b70.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_b70.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b70.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_1278.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1278.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1278.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1278.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1278.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1278.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_bd0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_bd0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_bd0.m_options);
  local_bd0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_bd0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bd0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_bd0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bd0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_f08.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_f08.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f08.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f08.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f08.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_f08.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_f08.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f08.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_c30.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_c30.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_c30.m_options);
  local_c30.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_c30.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c30.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c30.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c30.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_eb0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_eb0.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_eb0.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_eb0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_eb0.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_eb0.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_eb0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_eb0.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_c90.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_c90.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_c90.m_options);
  local_c90.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_c90.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c90.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c90.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c90.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_e58.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_e58.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e58.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e58.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_e58.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_e58.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e58.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_cf0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_cf0.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_cf0.m_options);
  local_cf0.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_cf0.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cf0.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_cf0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cf0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_e00.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__Opt_001af3d0;
  if (local_e00.m_optNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e00.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e00.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e00.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_e00.super_ParserRefImpl<Catch::Clara::Opt>.super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_e00.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e00.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_d50.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001b07f8;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_d50.m_args);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector(&local_d50.m_options);
  local_d50.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001af408;
  if (local_d50.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d50.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_da8.super_Opt.super_ParserRefImpl<Catch::Clara::Opt>.
  super_ComposableParserImpl<Catch::Clara::Opt>.super_ParserBase._vptr_ParserBase =
       (ParserBase)&PTR__Opt_001af3d0;
  if (local_da8.super_Opt.m_optNames.
      super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_da8.super_Opt.m_optNames.
                    super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_da8.super_Opt.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_da8.super_Opt.m_optNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_da8.super_Opt.super_ParserRefImpl<Catch::Clara::Opt>.
  super_ComposableParserImpl<Catch::Clara::Opt>.super_ParserBase._vptr_ParserBase =
       (ParserBase)&PTR__ParserRefImpl_001b24d0;
  if (local_da8.super_Opt.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_da8.super_Opt.super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_19c0.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase._vptr_ParserBase =
       (ParserBase)&PTR__ExeName_001af408;
  if (local_19c0.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_19c0.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_19c0.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_19c0.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace Clara;

        auto const setWarning = [&]( std::string const& warning ) {
            if ( warning == "NoAssertions" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::NoAssertions);
                return ParserResult::ok( ParseResultType::Matched );
            } else if ( warning == "UnmatchedTestSpec" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::UnmatchedTestSpec);
                return ParserResult::ok( ParseResultType::Matched );
            }

            return ParserResult ::runtimeError(
                "Unrecognised warning option: '" + warning + '\'' );
        };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + '\'' );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + CATCH_MOVE(line) + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = TestRunOrder::Declared;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = TestRunOrder::LexicographicallySorted;
                else if( startsWith( "random", order ) )
                    config.runOrder = TestRunOrder::Randomized;
                else
                    return ParserResult::runtimeError( "Unrecognised ordering: '" + order + '\'' );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed == "time" ) {
                    config.rngSeed = generateRandomSeed(GenerateFrom::Time);
                    return ParserResult::ok(ParseResultType::Matched);
                } else if (seed == "random-device") {
                    config.rngSeed = generateRandomSeed(GenerateFrom::RandomDevice);
                    return ParserResult::ok(ParseResultType::Matched);
                }

                // TODO: ideally we should be parsing uint32_t directly
                //       fix this later when we add new parse overload
                auto parsedSeed = parseUInt( seed, 0 );
                if ( !parsedSeed ) {
                    return ParserResult::runtimeError( "Could not parse '" + seed + "' as seed" );
                }
                config.rngSeed = *parsedSeed;
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setDefaultColourMode = [&]( std::string const& colourMode ) {
            Optional<ColourMode> maybeMode = Catch::Detail::stringToColourMode(toLower( colourMode ));
            if ( !maybeMode ) {
                return ParserResult::runtimeError(
                    "colour mode must be one of: default, ansi, win32, "
                    "or none. '" +
                    colourMode + "' is not recognised" );
            }
            auto mode = *maybeMode;
            if ( !isColourImplAvailable( mode ) ) {
                return ParserResult::runtimeError(
                    "colour mode '" + colourMode +
                    "' is not supported in this binary" );
            }
            config.defaultColourMode = mode;
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + '\'' );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& userReporterSpec ) {
            if ( userReporterSpec.empty() ) {
                return ParserResult::runtimeError( "Received empty reporter spec." );
            }

            Optional<ReporterSpec> parsed =
                parseReporterSpec( userReporterSpec );
            if ( !parsed ) {
                return ParserResult::runtimeError(
                    "Could not parse reporter spec '" + userReporterSpec +
                    "'" );
            }

            auto const& reporterSpec = *parsed;

            auto const& factories =
                getRegistryHub().getReporterRegistry().getFactories();
            auto result = factories.find( reporterSpec.name() );

            if ( result == factories.end() ) {
                return ParserResult::runtimeError(
                    "Unrecognized reporter, '" + reporterSpec.name() +
                    "'. Check available with --list-reporters" );
            }


            const bool hadOutputFile = reporterSpec.outputFile().some();
            config.reporterSpecifications.push_back( CATCH_MOVE( *parsed ) );
            // It would be enough to check this only once at the very end, but
            // there is  not a place where we could call this check, so do it
            // every time it could fail. For valid inputs, this is still called
            // at most once.
            if (!hadOutputFile) {
                int n_reporters_without_file = 0;
                for (auto const& spec : config.reporterSpecifications) {
                    if (spec.outputFile().none()) {
                        n_reporters_without_file++;
                    }
                }
                if (n_reporters_without_file > 1) {
                    return ParserResult::runtimeError( "Only one reporter may have unspecified output file." );
                }
            }

            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setShardCount = [&]( std::string const& shardCount ) {
            auto parsedCount = parseUInt( shardCount );
            if ( !parsedCount ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardCount + "' as shard count" );
            }
            if ( *parsedCount == 0 ) {
                return ParserResult::runtimeError(
                    "Shard count must be positive" );
            }
            config.shardCount = *parsedCount;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto const setShardIndex = [&](std::string const& shardIndex) {
            auto parsedIndex = parseUInt( shardIndex );
            if ( !parsedIndex ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardIndex + "' as shard index" );
            }
            config.shardIndex = *parsedIndex;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.defaultOutputFilename, "filename" )
                ["-o"]["--out"]
                ( "default output filename" )
            | Opt( accept_many, setReporter, "name[::key=value]*" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( accept_many, setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTests )
                ["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all available reporters" )
            | Opt( config.listListeners )
                ["--list-listeners"]
                ( "list all listeners" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|'random-device'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setDefaultColourMode, "ansi|win32|none|default" )
                ["--colour-mode"]
                ( "what color mode should be used as default" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.skipBenchmarks)
                ["--skip-benchmarks"]
                ( "disable running benchmarks")
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Opt( setShardCount, "shard count" )
                ["--shard-count"]
                ( "split the tests to execute into this many groups" )
            | Opt( setShardIndex, "shard index" )
                ["--shard-index"]
                ( "index of the group of tests to execute (see --shard-count)" )
            | Opt( config.allowZeroTests )
                ["--allow-running-no-tests"]
                ( "Treat 'No tests run' as a success" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }